

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS
ref_mpi_balance(REF_MPI ref_mpi,REF_INT ldim,REF_INT nitem,void *items,REF_INT first_rank,
               REF_INT last_rank,REF_INT *nbalanced,void **balanced,REF_TYPE type)

{
  size_t __size;
  uint *puVar1;
  uint uVar2;
  REF_MPI pRVar3;
  uint uVar4;
  int iVar5;
  REF_STATUS RVar6;
  int *piVar7;
  uint *__ptr;
  REF_INT *proc;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  REF_INT total;
  int *local_60;
  ulong local_58;
  REF_MPI local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  REF_INT local_3c;
  ulong local_38;
  
  total = nitem;
  local_50 = ref_mpi;
  uVar4 = ref_mpi_allsum(ref_mpi,&total,1,1);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x4aa,
           "ref_mpi_balance",(ulong)uVar4,"total items");
    return uVar4;
  }
  uVar4 = (last_rank - first_rank) + 1;
  iVar8 = local_50->id;
  iVar5 = 0;
  uVar10 = 0;
  if (iVar8 <= last_rank && first_rank <= iVar8) {
    iVar5 = total / (int)uVar4;
    uVar10 = (long)total % (long)(int)uVar4 & 0xffffffff;
  }
  iVar12 = 0;
  if (0 < iVar8 - first_rank) {
    iVar12 = iVar8 - first_rank;
  }
  uVar15 = (uint)(iVar12 < (int)uVar10) + iVar5;
  *nbalanced = uVar15;
  uVar2 = local_50->n;
  local_44 = first_rank;
  local_40 = last_rank;
  local_3c = ldim;
  if ((long)(int)uVar2 < 0) {
    pcVar14 = "malloc haves of REF_INT negative";
    uVar11 = 0x4b8;
LAB_0020de6b:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar11,
           "ref_mpi_balance",pcVar14);
LAB_0020de72:
    RVar6 = 1;
  }
  else {
    __size = (long)(int)uVar2 * 4;
    local_58 = (ulong)(uint)nitem;
    local_38 = uVar10;
    piVar7 = (int *)malloc(__size);
    if (piVar7 == (int *)0x0) {
      pcVar14 = "malloc haves of REF_INT NULL";
      uVar11 = 0x4b8;
    }
    else {
      local_60 = piVar7;
      local_48 = uVar4;
      __ptr = (uint *)malloc(__size);
      if (__ptr == (uint *)0x0) {
        pcVar14 = "malloc shares of REF_INT NULL";
        uVar11 = 0x4b9;
      }
      else {
        *__ptr = uVar15;
        *local_60 = (int)local_58;
        if ((int)local_58 < 0) {
          pcVar14 = "malloc destination of REF_INT negative";
          uVar11 = 0x4bd;
          goto LAB_0020de6b;
        }
        uVar10 = local_58 & 0xffffffff;
        proc = (REF_INT *)malloc(uVar10 * 4);
        pRVar3 = local_50;
        if (proc != (REF_INT *)0x0) {
          for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
            proc[uVar9] = 0;
          }
          uVar13 = 0;
          uVar9 = (ulong)(uint)local_50->id;
          if (local_50->id < 1) {
            uVar9 = uVar13;
          }
          iVar8 = 0;
          for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
            iVar8 = iVar8 + local_60[uVar13];
          }
          for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
            iVar5 = iVar8 + (int)uVar9;
            for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
              puVar1 = __ptr + uVar13;
              if (iVar5 < (int)*puVar1) goto LAB_0020df0b;
              iVar5 = iVar5 - *puVar1;
            }
            uVar13 = (ulong)(uVar2 - 1);
LAB_0020df0b:
            proc[uVar9] = (REF_INT)uVar13;
          }
          uVar4 = ref_mpi_blindsend(local_50,proc,items,local_3c,(REF_INT)local_58,balanced,
                                    nbalanced,type);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                   0x4c8,"ref_mpi_balance",(ulong)uVar4,"blind send node");
            return uVar4;
          }
          if (uVar15 == *nbalanced) {
            free(proc);
            free(__ptr);
            free(local_60);
            return 0;
          }
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                 0x4d1,"ref_mpi_balance","share mismatch",(long)(int)uVar15,(long)*nbalanced);
          printf("rank %d first %d last %d active %d total %d rem %d share %d nitem %d\n",
                 (ulong)(uint)pRVar3->id,(ulong)local_44,(ulong)local_40,(ulong)local_48,
                 (ulong)(uint)total,local_38,(ulong)uVar15,local_58);
          for (lVar16 = 0; lVar16 < pRVar3->n; lVar16 = lVar16 + 1) {
            printf(" %d",(ulong)__ptr[lVar16]);
          }
          putchar(10);
          goto LAB_0020de72;
        }
        pcVar14 = "malloc destination of REF_INT NULL";
        uVar11 = 0x4bd;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar11,
           "ref_mpi_balance",pcVar14);
    RVar6 = 2;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_balance(REF_MPI ref_mpi, REF_INT ldim, REF_INT nitem,
                                   void *items, REF_INT first_rank,
                                   REF_INT last_rank, REF_INT *nbalanced,
                                   void **balanced, REF_TYPE type) {
  REF_INT *shares, total, share, remainder;
  REF_INT *haves;
  REF_INT *destination, offset, part, i;
  REF_INT active;

  active = last_rank - first_rank + 1;

  total = nitem;
  RSS(ref_mpi_allsum(ref_mpi, &total, 1, REF_INT_TYPE), "total items");
  if (first_rank <= ref_mpi_rank(ref_mpi) &&
      ref_mpi_rank(ref_mpi) <= last_rank) {
    share = total / active;
    remainder = total - share * active;
  } else {
    share = 0;
    remainder = 0;
  }
  if (MAX(0, ref_mpi_rank(ref_mpi) - first_rank) < remainder) {
    share++;
  }
  *nbalanced = share;

  ref_malloc(haves, ref_mpi_n(ref_mpi), REF_INT);
  ref_malloc(shares, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &share, shares, REF_INT_TYPE), "all share");
  RSS(ref_mpi_allgather(ref_mpi, &nitem, haves, REF_INT_TYPE), "all share");

  ref_malloc_init(destination, nitem, REF_INT, 0);
  offset = 0;
  for (part = 0; part < ref_mpi_rank(ref_mpi); part++) {
    offset += haves[part];
  }
  for (i = 0; i < nitem; i++) {
    destination[i] = find_destination(ref_mpi_n(ref_mpi), shares, offset + i);
  }

  RSS(ref_mpi_blindsend(ref_mpi, destination, items, ldim, nitem, balanced,
                        nbalanced, type),
      "blind send node");
  REIB(share, *nbalanced, "share mismatch", {
    printf(
        "rank %d first %d last %d active %d total %d rem %d share %d nitem "
        "%d\n",
        ref_mpi_rank(ref_mpi), first_rank, last_rank, active, total, remainder,
        share, nitem);
    for (i = 0; i < ref_mpi_n(ref_mpi); i++) printf(" %d", shares[i]);
    printf("\n");
  });

  ref_free(destination);
  ref_free(shares);
  ref_free(haves);

  return REF_SUCCESS;
}